

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printVersion(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  Verbosity VVar1;
  SPxOut *t;
  SPxOut *in_RDI;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  char *in_stack_ffffffffffffffb8;
  Verbosity local_38;
  Verbosity local_34 [3];
  Verbosity local_28;
  Verbosity local_24 [3];
  Verbosity local_18;
  Verbosity local_14 [5];
  
  if ((in_RDI != (SPxOut *)0xfffffffffffffff8) &&
     (VVar1 = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity), 2 < (int)VVar1)) {
    local_14[2] = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity);
    local_14[1] = 3;
    SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,local_14 + 1);
    soplex::operator<<(in_RDI,in_stack_ffffffffffffffb8);
    soplex::operator<<(in_RDI,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    soplex::operator<<(in_RDI,in_stack_ffffffffffffffb8);
    soplex::operator<<(in_RDI,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    soplex::operator<<(in_RDI,in_stack_ffffffffffffffb8);
    soplex::operator<<(in_RDI,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,local_14 + 2);
  }
  if ((in_RDI != (SPxOut *)0xfffffffffffffff8) &&
     (VVar1 = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity), 2 < (int)VVar1)) {
    local_14[0] = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity);
    local_18 = INFO1;
    SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,&local_18);
    soplex::operator<<(in_RDI,in_stack_ffffffffffffffb8);
    SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,local_14);
  }
  if ((in_RDI != (SPxOut *)0xfffffffffffffff8) &&
     (VVar1 = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity), 2 < (int)VVar1)) {
    local_24[2] = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity);
    local_24[1] = 3;
    SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,local_24 + 1);
    soplex::operator<<(in_RDI,in_stack_ffffffffffffffb8);
    soplex::operator<<(in_RDI,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    soplex::operator<<(in_RDI,in_stack_ffffffffffffffb8);
    SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,local_24 + 2);
  }
  if ((in_RDI != (SPxOut *)0xfffffffffffffff8) &&
     (VVar1 = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity), 2 < (int)VVar1)) {
    local_24[0] = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity);
    local_28 = INFO1;
    SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,&local_28);
    soplex::operator<<(in_RDI,in_stack_ffffffffffffffb8);
    SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,local_24);
  }
  if ((in_RDI != (SPxOut *)0xfffffffffffffff8) &&
     (VVar1 = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity), 2 < (int)VVar1)) {
    local_34[2] = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity);
    local_34[1] = 3;
    SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,local_34 + 1);
    soplex::operator<<(in_RDI,in_stack_ffffffffffffffb8);
    SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,local_34 + 2);
  }
  if ((in_RDI != (SPxOut *)0xfffffffffffffff8) &&
     (VVar1 = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity), 2 < (int)VVar1)) {
    local_34[0] = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity);
    local_38 = INFO1;
    SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,&local_38);
    t = soplex::operator<<(in_RDI,in_stack_ffffffffffffffb8);
    getGitHash();
    soplex::operator<<(in_RDI,(char *)t);
    soplex::operator<<(in_RDI,(char *)t);
    SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,local_34);
  }
  return;
}

Assistant:

void SoPlexBase<R>::printVersion() const
{
   // do not use preprocessor directives within the SPX_MSG_INFO1 macro
   SPX_MSG_INFO1(spxout, spxout << "SoPlex version " << SOPLEX_VERSION / 100
                 << "." << (SOPLEX_VERSION % 100) / 10
                 << "." << SOPLEX_VERSION % 10);

#ifndef NDEBUG
   SPX_MSG_INFO1(spxout, spxout << " [mode: debug]");
#else
   SPX_MSG_INFO1(spxout, spxout << " [mode: optimized]");
#endif

   SPX_MSG_INFO1(spxout, spxout << " [precision: " << (int)sizeof(R) << " byte]");

#ifdef SOPLEX_WITH_GMP
#ifdef mpir_version
   SPX_MSG_INFO1(spxout, spxout << " [rational: MPIR " << mpir_version << "]");
#else
   SPX_MSG_INFO1(spxout, spxout << " [rational: GMP " << gmp_version << "]");
#endif
#else
   SPX_MSG_INFO1(spxout, spxout << " [rational: long double]");
#endif


#ifdef SOPLEX_WITH_PAPILO
   SPX_MSG_INFO1(spxout, spxout << " [PaPILO  " << PAPILO_VERSION_MAJOR << "." << PAPILO_VERSION_MINOR
                 << "." << PAPILO_VERSION_PATCH);
#ifdef PAPILO_GITHASH_AVAILABLE
   SPX_MSG_INFO1(spxout, spxout << " {" <<  PAPILO_GITHASH << "}");
#endif
   SPX_MSG_INFO1(spxout, spxout << "]\n");
#else
   SPX_MSG_INFO1(spxout, spxout << " [PaPILO: not available]");
#endif

   SPX_MSG_INFO1(spxout, spxout << " [githash: " << getGitHash() << "]\n");
}